

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O0

int file_read_fn(spng_ctx *ctx,void *user,void *data,size_t n)

{
  int iVar1;
  size_t sVar2;
  FILE *file;
  size_t n_local;
  void *data_local;
  void *user_local;
  spng_ctx *ctx_local;
  
  sVar2 = fread(data,n,1,(FILE *)user);
  if (sVar2 == 1) {
    ctx_local._4_4_ = 0;
  }
  else {
    iVar1 = feof((FILE *)user);
    if (iVar1 == 0) {
      ctx_local._4_4_ = -2;
    }
    else {
      ctx_local._4_4_ = -1;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static int file_read_fn(spng_ctx *ctx, void *user, void *data, size_t n)
{
    FILE *file = user;
    (void)ctx;

    if(fread(data, n, 1, file) != 1)
    {
        if(feof(file)) return SPNG_IO_EOF;
        else return SPNG_IO_ERROR;
    }

    return 0;
}